

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3gau_full_io.c
# Opt level: O0

int s3gau_write_full(char *fn,vector_t ****out,uint32 n_mgau,uint32 n_feat,uint32 n_density,
                    uint32 *veclen)

{
  int32 iVar1;
  uint uVar2;
  int iVar3;
  uint32 local_50;
  uint local_4c;
  uint32 ignore;
  uint32 i;
  uint32 blk;
  uint32 chksum;
  FILE *fp;
  uint32 *veclen_local;
  uint32 local_28;
  uint32 n_density_local;
  uint32 n_feat_local;
  uint32 n_mgau_local;
  vector_t ****out_local;
  char *fn_local;
  
  _blk = (FILE *)0x0;
  i = 0;
  local_50 = 0;
  fp = (FILE *)veclen;
  veclen_local._4_4_ = n_density;
  local_28 = n_feat;
  n_density_local = n_mgau;
  _n_feat_local = out;
  out_local = (vector_t ****)fn;
  s3clr_fattr();
  s3add_fattr("version","1.0",1);
  s3add_fattr("chksum0","yes",1);
  _blk = s3open((char *)out_local,"wb",(uint32 *)0x0);
  if (_blk != (FILE *)0x0) {
    iVar1 = bio_fwrite(&n_density_local,4,1,_blk,0,&i);
    if ((((iVar1 == 1) && (iVar1 = bio_fwrite(&local_28,4,1,_blk,0,&i), iVar1 == 1)) &&
        (iVar1 = bio_fwrite((void *)((long)&veclen_local + 4),4,1,_blk,0,&i), iVar1 == 1)) &&
       (uVar2 = bio_fwrite(fp,4,local_28,_blk,0,&i), uVar2 == local_28)) {
      ignore = 0;
      for (local_4c = 0; local_4c < local_28; local_4c = local_4c + 1) {
        ignore = (&fp->_flags)[local_4c] * (&fp->_flags)[local_4c] + ignore;
      }
      iVar3 = bio_fwrite_1d(****_n_feat_local,4,n_density_local * veclen_local._4_4_ * ignore,_blk,
                            &i);
      if ((-1 < iVar3) && (iVar1 = bio_fwrite(&i,4,1,_blk,0,&local_50), iVar1 == 1)) {
        s3close(_blk);
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3gau_full_io.c"
                ,0xf9,"Wrote %s [%ux%ux%u array of full matrices]\n",out_local,
                (ulong)n_density_local,local_28,veclen_local._4_4_);
        return 0;
      }
    }
    if (_blk != (FILE *)0x0) {
      s3close(_blk);
    }
  }
  return -1;
}

Assistant:

int
s3gau_write_full(const char *fn,
		 const vector_t ****out,
		 uint32 n_mgau,
		 uint32 n_feat,
		 uint32 n_density,
		 const uint32 *veclen)
{
    FILE *fp = NULL;
    uint32 chksum = 0;
    uint32 blk, i, ignore = 0;

    s3clr_fattr();
    s3add_fattr("version", GAU_FILE_VERSION, TRUE);
    s3add_fattr("chksum0", "yes", TRUE);

    fp = s3open(fn, "wb", NULL);
    if (fp == NULL)
	return S3_ERROR;

    if (bio_fwrite(&n_mgau, sizeof(uint32), 1, fp, 0, &chksum) != 1) {
	goto error;
    }

    if (bio_fwrite(&n_feat, sizeof(uint32), 1, fp, 0, &chksum) != 1) {
	goto error;
    }

    if (bio_fwrite(&n_density, sizeof(uint32), 1, fp, 0, &chksum) != 1) {
	goto error;
    }

    if (bio_fwrite(veclen, sizeof(uint32), n_feat, fp, 0, &chksum) != n_feat) {
	goto error;
    }

    for (blk = 0, i = 0; i < n_feat; i++)
	blk += veclen[i] * veclen[i];

    if (bio_fwrite_1d(out[0][0][0][0], sizeof(float32),
		   n_mgau*n_density*blk, fp, &chksum) < 0) {
	goto error;
    }

    if (bio_fwrite(&chksum, sizeof(uint32), 1, fp, 0, &ignore) != 1) {
	goto error;
    }

    s3close(fp);

    E_INFO("Wrote %s [%ux%ux%u array of full matrices]\n",
	   fn, n_mgau, n_feat, n_density);

    return S3_SUCCESS;

error:
    if (fp) s3close(fp);
    return S3_ERROR;
}